

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NotEqualExpression.cpp
# Opt level: O0

NotEqualExpression * __thiscall
ninx::parser::element::NotEqualExpression::clone_impl(NotEqualExpression *this)

{
  NotEqualExpression *this_00;
  ASTElement local_30;
  Block *local_10;
  NotEqualExpression *this_local;
  
  local_10 = (Block *)this;
  this_00 = (NotEqualExpression *)operator_new(0x28);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::operator->(&(this->super_BinaryExpression).first);
  ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)&stack0xffffffffffffffe8);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::operator->(&(this->super_BinaryExpression).second);
  ASTElement::clone<ninx::parser::element::Expression>(&local_30);
  NotEqualExpression(this_00,(unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                              *)&stack0xffffffffffffffe8,
                     (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                      *)&local_30);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *)&local_30);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *)&stack0xffffffffffffffe8);
  return this_00;
}

Assistant:

ninx::parser::element::NotEqualExpression *ninx::parser::element::NotEqualExpression::clone_impl() {
    return new NotEqualExpression(this->first->clone<Expression>(), this->second->clone<Expression>());
}